

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O2

int publickey_response_success(LIBSSH2_PUBLICKEY *pkey)

{
  LIBSSH2_SESSION *session;
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  uint32_t uVar4;
  char *errmsg;
  int iStack_50;
  uchar *s;
  uchar *data;
  size_t data_len;
  
  session = pkey->channel->session;
  do {
    iVar3 = publickey_packet_receive(pkey,&data,&data_len);
    sVar2 = data_len;
    puVar1 = data;
    if (iVar3 != 0) {
      if (iVar3 == -0x25) {
        return -0x25;
      }
      errmsg = "Timeout waiting for response from publickey subsystem";
      iStack_50 = -0x1e;
LAB_0011eb47:
      iVar3 = _libssh2_error(session,iStack_50,errmsg);
      return iVar3;
    }
    if (data_len < 4) {
LAB_0011eb33:
      errmsg = "Publickey response too small";
      iStack_50 = -0x26;
      goto LAB_0011eb47;
    }
    s = data;
    iVar3 = publickey_response_id(&s,data_len);
    if (iVar3 == 0) {
      if (7 < sVar2) {
        uVar4 = _libssh2_ntohu32(s);
        (*session->free)(puVar1,&session->abstract);
        if (uVar4 != 0) {
          publickey_status_error(pkey,session,(ulong)uVar4);
          return -1;
        }
        return 0;
      }
      goto LAB_0011eb33;
    }
    (*session->free)(puVar1,&session->abstract);
    if (iVar3 < 0) {
      errmsg = "Invalid publickey subsystem response";
      iStack_50 = -0x24;
      goto LAB_0011eb47;
    }
    _libssh2_error(session,-0x24,"Unexpected publickey subsystem response");
    data = (uchar *)0x0;
  } while( true );
}

Assistant:

static int
publickey_response_success(LIBSSH2_PUBLICKEY * pkey)
{
    LIBSSH2_SESSION *session = pkey->channel->session;
    unsigned char *data, *s;
    size_t data_len;
    int response;

    for(;;) {
        int rc = publickey_packet_receive(pkey, &data, &data_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                                  "Timeout waiting for response from "
                                  "publickey subsystem");
        }

        if(data_len < 4) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Publickey response too small");
        }

        s = data;
        response = publickey_response_id(&s, data_len);

        switch(response) {
        case LIBSSH2_PUBLICKEY_RESPONSE_STATUS:
            /* Error, or processing complete */
        {
            unsigned long status = 0;

            if(data_len < 8) {
                return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                      "Publickey response too small");
            }

            status = _libssh2_ntohu32(s);

            LIBSSH2_FREE(session, data);

            if(status == LIBSSH2_PUBLICKEY_SUCCESS)
                return 0;

            publickey_status_error(pkey, session, status);
            goto err_exit;
        }
        default:
            LIBSSH2_FREE(session, data);
            if(response < 0) {
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                                      "Invalid publickey subsystem response");
            }
            /* Unknown/Unexpected */
            _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                           "Unexpected publickey subsystem response");
            data = NULL;
        }
    }
err_exit:
    return -1;
}